

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O2

void test_z5_standart_field_constructors<Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>>
               (void)

{
  uint __old_val;
  Element_conflict EVar1;
  uint __tmp;
  Shared_Zp_field_element<unsigned_int,_void> z5_d;
  Element_conflict local_220;
  Shared_Zp_field_element<unsigned_int,_void> z5_m2;
  undefined4 local_218;
  Shared_Zp_field_element<unsigned_int,_void> z5_c3;
  Shared_Zp_field_element<unsigned_int,_void> z5_c2;
  Shared_Zp_field_element<unsigned_int,_void> z5_v;
  undefined **local_208;
  undefined1 local_200;
  undefined8 *local_1f8;
  char *local_1f0;
  undefined4 local_1e8;
  Element_conflict local_1e4;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  z5_d.element_ = 0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x45);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_58 = "";
  z5_v.element_ = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_60,0x45,1,2,&z5_d,"z5_d",&z5_v,"0");
  z5_v.element_ =
       Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::_get_value<int,void>
                 (7);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x49);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_88 = "";
  z5_c2.element_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_90,0x49,1,2,&z5_v,"z5_v",&z5_c2,"2");
  z5_d.element_ =
       Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::_get_value<int,void>
                 (7);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x4b);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_b8 = "";
  z5_c2.element_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_c0,0x4b,1,2,&z5_d,"z5_d",&z5_c2,"2");
  z5_c2.element_ =
       Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::_get_value<int,void>
                 (7);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x50);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_e8 = "";
  z5_c3.element_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_f0,0x50,1,2,&z5_c2,"z5_c2",&z5_c3,"2",2);
  z5_c3 = z5_c2;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x52);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_118 = "";
  local_218 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_120,0x52,1,2,&z5_c3,"z5_c3",&local_218,"2");
  z5_m2.element_ =
       Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::_get_value<int,void>
                 (7);
  local_218 = 0;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x57);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_148 = "";
  local_220 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_150,0x57,1,2,&z5_m2,"z5_m2",&local_220,"2");
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x58);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_178 = "";
  local_220 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_180,0x58,1,2,&local_218,"z5_m1",&local_220,"0");
  EVar1 = Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::
          _get_value<int,void>(4);
  local_220 = Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>::
              _get_value<int,void>(8);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e4 = EVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x5e);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1a8 = "";
  local_1e8 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_1b0,0x5e,1,2,&local_1e4,"z5_s2",&local_1e8,"4");
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x5f);
  local_200 = 0;
  local_208 = &PTR__lazy_ostream_00129ae8;
  local_1f8 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_1d8 = "";
  local_1e8 = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>,int>
            (&local_208,&local_1e0,0x5f,1,2,&local_220,"z5_s1",&local_1e8,"3");
  return;
}

Assistant:

void test_z5_standart_field_constructors() {
  // default constructor
  Z5 z5_d;
  BOOST_CHECK_EQUAL(z5_d, 0);

  // value constructor
  Z5 z5_v(7);
  BOOST_CHECK_EQUAL(z5_v, 2);
  z5_d = 7;
  BOOST_CHECK_EQUAL(z5_d, 2);

  // copy constructor
  Z5 z5_c1(7);
  Z5 z5_c2 = z5_c1;
  BOOST_CHECK_EQUAL(z5_c2, 2);
  Z5 z5_c3(z5_c2);
  BOOST_CHECK_EQUAL(z5_c3, 2);

  // move constructor
  Z5 z5_m1(7);
  Z5 z5_m2(std::move(z5_m1));
  BOOST_CHECK_EQUAL(z5_m2, 2);
  BOOST_CHECK_EQUAL(z5_m1, 0);

  // swap
  Z5 z5_s1(4);
  Z5 z5_s2(8);
  swap(z5_s1, z5_s2);
  BOOST_CHECK_EQUAL(z5_s2, 4);
  BOOST_CHECK_EQUAL(z5_s1, 3);
}